

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O2

Maybe<int> __thiscall capnp::getSendBufferSize(capnp *this,AsyncIoStream *stream)

{
  int bufSize;
  uint len;
  Fault local_508;
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  NullableValue<kj::Exception> local_4d8;
  NullableValue<kj::Exception> _exception467;
  
  bufSize = 0;
  len = 4;
  (*(stream->super_AsyncInputStream)._vptr_AsyncInputStream[8])(stream,1,7,&bufSize,&len);
  _kjCondition.result = len == 4;
  _kjCondition.right = 4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &len;
  if (!_kjCondition.result) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&>
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++"
               ,0x1d2,FAILED,"len == sizeof(bufSize)","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::~Fault(&local_508);
  }
  local_4d8.isSet = false;
  kj::_::NullableValue<kj::Exception>::NullableValue(&_exception467,&local_4d8);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_4d8);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&_exception467);
  if (_exception467.isSet == false) {
    *(int *)(this + 4) = bufSize;
  }
  *this = (capnp)(_exception467.isSet == false);
  return (Maybe<int>)(NullableValue<int>)this;
}

Assistant:

kj::Maybe<int> getSendBufferSize(kj::AsyncIoStream& stream) {
  // TODO(perf): It might be nice to have a tryGetsockopt() that doesn't require catching
  //   exceptions?
  int bufSize = 0;
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    uint len = sizeof(int);
    stream.getsockopt(SOL_SOCKET, SO_SNDBUF, &bufSize, &len);
    KJ_ASSERT(len == sizeof(bufSize)) { break; }
  })) {
    if (exception.getType() != kj::Exception::Type::UNIMPLEMENTED) {
      // TODO(someday): Figure out why getting SO_SNDBUF sometimes throws EINVAL. I suspect it
      //   happens when the remote side has closed their read end, meaning we no longer have
      //   a send buffer, but I don't know what is the best way to verify that that was actually
      //   the reason. I'd prefer not to ignore EINVAL errors in general.

      // kj::throwRecoverableException(kj::mv(exception));
    }
    return kj::none;
  }
  return bufSize;
}